

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O0

void __thiscall serialization::xml_oarchive::save_sequence_item_start(xml_oarchive *this)

{
  xml_node<char> *child;
  xml_node<char> *node;
  xml_oarchive *pxStack_10;
  serialization_trace trace;
  xml_oarchive *this_local;
  
  pxStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[25],char_const(&)[4]>
            ((serialization_trace *)((long)&node + 7),(char (*) [25])"save_sequence_item_start",
             (char (*) [4])"xml");
  child = rapidxml::memory_pool<char>::allocate_node
                    (&(this->document_).super_memory_pool<char>,node_element,"item",(char *)0x0,0,0)
  ;
  rapidxml::xml_node<char>::append_node(this->current_,child);
  this->current_ = child;
  return;
}

Assistant:

void save_sequence_item_start()
    {
        serialization_trace trace(__func__, "xml");
        auto node = document_.allocate_node(rapidxml::node_element, "item");
        current_->append_node(node);
        current_ = node;
    }